

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

bool __thiscall
ImGuiWS::setTexture(ImGuiWS *this,TextureId textureId,Type textureType,int32_t width,int32_t height,
                   char *data)

{
  _Rb_tree_color _Var1;
  pointer pcVar2;
  _Rb_tree_header *p_Var3;
  int32_t iVar4;
  int32_t iVar5;
  mapped_type *pmVar6;
  _Rb_tree_color *p_Var7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  int iVar11;
  _Head_base<0UL,_ImGuiWS::Impl_*,_false> _Var12;
  int iVar13;
  size_t __n;
  bool bVar14;
  unique_lock<std::shared_mutex> lock;
  TextureId local_5c;
  int local_58;
  Type local_54;
  int32_t local_50;
  int32_t local_4c;
  unique_lock<std::shared_mutex> local_48;
  char *local_38;
  
  iVar11 = 4;
  if (textureType != RGBA32) {
    iVar11 = (uint)(textureType == RGB24) * 2 + 1;
  }
  _Var12._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  p_Var8 = *(_Base_ptr *)((long)&(_Var12._M_head_impl)->dataWrite + 0x40);
  local_5c = textureId;
  local_54 = textureType;
  local_50 = width;
  local_4c = height;
  local_38 = data;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var3 = (_Rb_tree_header *)((long)&(_Var12._M_head_impl)->dataWrite + 0x38);
    p_Var10 = (_Base_ptr)p_Var3;
    do {
      bVar14 = p_Var8[1]._M_color < textureId;
      if (!bVar14) {
        p_Var10 = p_Var8;
      }
      p_Var8 = *(_Base_ptr *)((long)&p_Var8->_M_left + (ulong)bVar14 * 8);
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var3) && (p_Var10[1]._M_color <= textureId))
    goto LAB_00175b90;
  }
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&(_Var12._M_head_impl)->dataWrite + 0x30),&local_5c);
  pmVar6->revision = 0;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  pcVar2 = (pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar2) {
    (pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           *)&((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->dataWrite);
  _Var12._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  p_Var8 = *(_Base_ptr *)((long)&(_Var12._M_head_impl)->dataWrite + 0x48);
  p_Var3 = (_Rb_tree_header *)((long)&(_Var12._M_head_impl)->dataWrite + 0x38);
  if ((_Rb_tree_header *)p_Var8 != p_Var3) {
    iVar13 = 0;
    local_58 = iVar11;
    do {
      _Var1 = p_Var8[1]._M_color;
      local_48._M_device = (mutex_type *)CONCAT44(local_48._M_device._4_4_,iVar13);
      iVar13 = iVar13 + 1;
      p_Var7 = std::
               map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               ::operator[](&(((this->m_impl)._M_t.
                               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                               .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                             dataWrite).textureIdMap,(key_type *)&local_48);
      *p_Var7 = _Var1;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var3);
    _Var12._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
    iVar11 = local_58;
  }
LAB_00175b90:
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[](&((_Var12._M_head_impl)->dataWrite).textures,&local_5c);
  pmVar6->revision = pmVar6->revision + 1;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  iVar5 = local_4c;
  iVar4 = local_50;
  __n = (size_t)(local_4c * local_50 * iVar11);
  std::vector<char,_std::allocator<char>_>::resize(&pmVar6->data,__n + 0x14);
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  iVar11 = pmVar6->revision;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  *(TextureId *)
   (pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
   _M_start = local_5c;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  *(Type *)((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 4) = local_54;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  *(int32_t *)
   ((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + 8) = iVar4;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  *(int32_t *)
   ((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start + 0xc) = iVar5;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  *(int *)((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10) = iVar11;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  memcpy((pmVar6->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x14,local_38,__n);
  local_48._M_device =
       &((this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->mutex;
  local_48._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_48);
  local_48._M_owns = true;
  pmVar6 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataWrite + 0x30),&local_5c);
  pmVar9 = std::
           map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
           ::operator[]((map<unsigned_int,_ImGuiWS::Texture,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ImGuiWS::Texture>_>_>
                         *)((long)&((this->m_impl)._M_t.
                                    super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                    .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                   dataRead + 0x30),&local_5c);
  pmVar9->revision = pmVar6->revision;
  std::vector<char,_std::allocator<char>_>::operator=(&pmVar9->data,&pmVar6->data);
  _Var12._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)&(_Var12._M_head_impl)->dataRead,
              (_Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)&(_Var12._M_head_impl)->dataWrite);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48);
  return true;
}

Assistant:

bool ImGuiWS::setTexture(TextureId textureId, Texture::Type textureType, int32_t width, int32_t height, const char * data) {
    int bpp = 1; // bytes per pixel
    switch (textureType) {
        case Texture::Type::Alpha8: bpp = 1; break;
        case Texture::Type::Gray8:  bpp = 1; break;
        case Texture::Type::RGB24:  bpp = 3; break;
        case Texture::Type::RGBA32: bpp = 4; break;
    };

    if (m_impl->dataWrite.textures.find(textureId) == m_impl->dataWrite.textures.end()) {
        m_impl->dataWrite.textures[textureId].revision = 0;
        m_impl->dataWrite.textures[textureId].data.clear();
        m_impl->dataWrite.textureIdMap.clear();

        int idx = 0;
        for (const auto & t : m_impl->dataWrite.textures) {
            m_impl->dataWrite.textureIdMap[idx++] = t.first;
        }
    }

    m_impl->dataWrite.textures[textureId].revision++;
    m_impl->dataWrite.textures[textureId].data.resize(sizeof(TextureId) + sizeof(Texture::Type) + 3*sizeof(int32_t) + bpp*width*height);

    int revision = m_impl->dataWrite.textures[textureId].revision;

    size_t offset = 0;
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureId, sizeof(textureId)); offset += sizeof(textureId);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &textureType, sizeof(textureType)); offset += sizeof(textureType);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &width, sizeof(width)); offset += sizeof(width);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &height, sizeof(height)); offset += sizeof(height);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, &revision, sizeof(revision)); offset += sizeof(revision);
    std::memcpy(m_impl->dataWrite.textures[textureId].data.data() + offset, data, bpp*width*height);

    {
        std::unique_lock lock(m_impl->mutex);
        m_impl->dataRead.textures[textureId] = m_impl->dataWrite.textures[textureId];
        m_impl->dataRead.textureIdMap = m_impl->dataWrite.textureIdMap;
    }

    return true;
}